

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rich_text.cpp
# Opt level: O3

void __thiscall
Am_Text_Style_Run::Am_Text_Style_Run
          (Am_Text_Style_Run *this,unsigned_long inCharsInRun,Am_Font *inFont,Am_Style *inTextStyle,
          Am_Style *inBGStyle)

{
  Am_Font::Am_Font(&this->mFont,Am_FONT_FIXED,false,false,false,Am_FONT_MEDIUM);
  Am_Style::Am_Style(&this->mTextStyle);
  Am_Style::Am_Style(&this->mBGStyle);
  this->mCharsInRun = inCharsInRun;
  Am_Font::operator=(&this->mFont,inFont);
  Am_Style::operator=(&this->mTextStyle,inTextStyle);
  Am_Style::operator=(&this->mBGStyle,inBGStyle);
  this->mNext = (Am_Text_Style_Run *)0x0;
  return;
}

Assistant:

Am_Text_Style_Run::Am_Text_Style_Run(unsigned long inCharsInRun, Am_Font inFont,
                                     Am_Style inTextStyle, Am_Style inBGStyle)
{
  mCharsInRun = inCharsInRun;
  mFont = inFont;
  mTextStyle = inTextStyle;
  mBGStyle = inBGStyle;
  mNext = nullptr;
}